

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectHasEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  HeapEntity *pHVar3;
  bool bVar4;
  undefined1 manifesting;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *pvVar5;
  anon_union_8_3_4e909c26_for_v aVar6;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  allocator<char> local_79;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_78;
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_60;
  Type local_2c [3];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"objectHasEx",&local_79);
  local_2c[0] = OBJECT;
  local_2c[1] = STRING;
  local_2c[2] = 1;
  __l._M_len = 3;
  __l._M_array = local_2c;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_78,__l,in_RCX);
  pvVar5 = args;
  validateBuiltinArgs(this,loc,(string *)&local_60,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_78);
  manifesting = SUB81(pvVar5,0);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_60);
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = pVVar2[1].v.h;
  objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)&local_60,(Interpreter *)(pVVar2->v).h,(HeapObject *)(ulong)(pVVar2[2].v.b ^ 1),
               (bool)manifesting);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  for (; (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(local_60._M_impl.super__Rb_tree_header._M_header._M_left)) {
    bVar4 = std::operator==(*(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                              **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1),
                            (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                             *)(pHVar3 + 1));
    if (bVar4) break;
  }
  aVar6._1_7_ = 0;
  aVar6.b = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1;
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree(&local_60);
  (this->scratch).t = BOOLEAN;
  (this->scratch).v = aVar6;
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectHasEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(
            loc, "objectHasEx", args, {Value::OBJECT, Value::STRING, Value::BOOLEAN});
        const auto *obj = static_cast<const HeapObject *>(args[0].v.h);
        const auto *str = static_cast<const HeapString *>(args[1].v.h);
        bool include_hidden = args[2].v.b;
        bool found = false;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            if (field->name == str->value) {
                found = true;
                break;
            }
        }
        scratch = makeBoolean(found);
        return nullptr;
    }